

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

int container_get_cardinality(container_t *c,uint8_t typecode)

{
  uint uVar1;
  array_container_t *array;
  undefined1 in_SIL;
  container_t *in_RDI;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar2;
  int local_4;
  
  uVar2 = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  array = (array_container_t *)container_unwrap_shared(in_RDI,&stack0xffffffffffffffef);
  uVar1 = uVar2 >> 0x18;
  if (uVar1 == 1) {
    local_4 = bitset_container_cardinality((bitset_container_t *)array);
  }
  else if (uVar1 == 2) {
    local_4 = array_container_cardinality(array);
  }
  else {
    local_4 = run_container_cardinality((run_container_t *)CONCAT44(uVar2,uVar1));
  }
  return local_4;
}

Assistant:

static inline int container_get_cardinality(const container_t *c,
                                            uint8_t typecode) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_cardinality(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_cardinality(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_cardinality(const_CAST_run(c));
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}